

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BankAccount.cpp
# Opt level: O2

void __thiscall L13_2::BankAccountPlus::withdraw(BankAccountPlus *this,double amount)

{
  double dVar1;
  precis p;
  format f;
  
  f = set_format();
  p = *(precis *)(&std::bad_alloc::typeinfo + *(long *)(std::cout + -0x18));
  *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(std::cout + -0x18)) = 2;
  dVar1 = (this->super_BankAccount)._balance;
  if (amount < dVar1) {
    BankAccount::withdraw(&this->super_BankAccount,amount);
    reset_format(f,p);
    return;
  }
  if (amount < (this->_max_loan + dVar1) - this->_loan) {
    this->_loan = (this->_rate + 1.0) * (amount - dVar1) + this->_loan;
    std::operator<<((ostream *)&std::cout,"credit loan amount: $");
  }
  std::operator<<((ostream *)&std::cout,"Credit limit exceeded, Transaction aborted.\n");
}

Assistant:

void BankAccountPlus::withdraw(double amount) {
        format initState = set_format();
        precis initPrec = cout.precision(2);

        //  当前余额
//        double balance = get_balance();
        //  access through protected member
        double balance = _balance;
        if (amount < balance) {
            BankAccount::withdraw(amount);
        } else if (amount < balance + _max_loan - _loan) {
            //  取款同时进行信用贷款
            double loan = amount - balance;
            _loan += loan * (1.0 + _rate);
            cout << "credit loan amount: $" << loan << endl;
            cout << "credit loan charge: $" << loan * _rate << endl;
            //  先把不够的部分存进去
            deposit(loan);
            //  再取出来总的借贷额
            BankAccount::withdraw(amount);
        } else {
            cout << "Credit limit exceeded, Transaction aborted.\n";
        }

        reset_format(initState, initPrec);
    }